

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutex.cpp
# Opt level: O0

UBool icu_63::umtx_initImplPreInit(UInitOnce *uio)

{
  __int_type _Var1;
  int32_t state;
  UInitOnce *uio_local;
  
  pthread_mutex_lock((pthread_mutex_t *)initMutex);
  _Var1 = std::__atomic_base::operator_cast_to_int((__atomic_base *)uio);
  if (_Var1 == 0) {
    umtx_storeRelease(&uio->fState,1);
    pthread_mutex_unlock((pthread_mutex_t *)initMutex);
    uio_local._7_1_ = '\x01';
  }
  else {
    while (_Var1 = std::__atomic_base::operator_cast_to_int((__atomic_base *)uio), _Var1 == 1) {
      pthread_cond_wait((pthread_cond_t *)initCondition,(pthread_mutex_t *)initMutex);
    }
    pthread_mutex_unlock((pthread_mutex_t *)initMutex);
    uio_local._7_1_ = '\0';
  }
  return uio_local._7_1_;
}

Assistant:

U_COMMON_API UBool U_EXPORT2
umtx_initImplPreInit(UInitOnce &uio) {
    pthread_mutex_lock(&initMutex);
    int32_t state = uio.fState;
    if (state == 0) {
        umtx_storeRelease(uio.fState, 1);
        pthread_mutex_unlock(&initMutex);
        return TRUE;   // Caller will next call the init function.
    } else {
        while (uio.fState == 1) {
            // Another thread is currently running the initialization.
            // Wait until it completes.
            pthread_cond_wait(&initCondition, &initMutex);
        }
        pthread_mutex_unlock(&initMutex);
        U_ASSERT(uio.fState == 2);
        return FALSE;
    }
}